

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ObjToLit(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  
  pGVar3 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pGVar3) && (pGVar3 < pGVar1 + p->nObjs)) {
    iVar2 = (int)((ulong)((long)pGVar3 - (long)pGVar1) >> 2);
    if (-1 < iVar2 * -0x55555555) {
      return ((uint)pObj & 1) + iVar2 * 0x55555556;
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline int          Gia_ObjToLit( Gia_Man_t * p, Gia_Obj_t * pObj )     { return Abc_Var2Lit( Gia_ObjId(p, Gia_Regular(pObj)), Gia_IsComplement(pObj) ); }